

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bss_mem.c
# Opt level: O0

int mem_write(BIO *b,char *in,int inl)

{
  BIO_METHOD *pBVar1;
  OSSL_LIB_CTX *pOVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  int in_EDX;
  void *in_RSI;
  BIO *in_RDI;
  BIO_BUF_MEM *bbm;
  int blen;
  int ret;
  BIO *b_00;
  int in_stack_ffffffffffffffdc;
  int local_4;
  
  local_4 = -1;
  b_00 = (BIO *)in_RDI->prev_bio;
  if (((ulong)in_RDI->ptr & 0x200) == 0) {
    BIO_clear_flags(in_RDI,0xf);
    if (in_EDX == 0) {
      local_4 = 0;
    }
    else if (in_RSI == (void *)0x0) {
      ERR_new();
      ERR_set_debug((char *)CONCAT44(in_EDX,local_4),in_stack_ffffffffffffffdc,(char *)b_00);
      ERR_set_error(0x20,0xc0102,(char *)0x0);
    }
    else {
      iVar3 = (int)*(undefined8 *)b_00->method;
      mem_buf_sync(b_00);
      iVar4 = BUF_MEM_grow_clean((BUF_MEM *)b_00->libctx,(long)(iVar3 + in_EDX));
      if (CONCAT44(extraout_var,iVar4) != 0) {
        memcpy((void *)((long)((((b_00->libctx->data).ctx)->global).ex_data + -4) + (long)iVar3),
               in_RSI,(long)in_EDX);
        pBVar1 = b_00->method;
        pOVar2 = b_00->libctx;
        *(CRYPTO_RWLOCK **)pBVar1 = pOVar2->lock;
        pBVar1->name = (char *)(pOVar2->data).ctx;
        pBVar1->bwrite = (_func_int_BIO_ptr_char_ptr_size_t_size_t_ptr *)(pOVar2->data).sk;
        pBVar1->bwrite_old = (_func_int_BIO_ptr_char_ptr_int *)(pOVar2->global).ex_data_lock;
        local_4 = in_EDX;
      }
    }
  }
  else {
    ERR_new();
    ERR_set_debug((char *)CONCAT44(in_EDX,local_4),in_stack_ffffffffffffffdc,(char *)b_00);
    ERR_set_error(0x20,0x7e,(char *)0x0);
  }
  return local_4;
}

Assistant:

static int mem_write(BIO *b, const char *in, int inl)
{
    int ret = -1;
    int blen;
    BIO_BUF_MEM *bbm = (BIO_BUF_MEM *)b->ptr;

    if (b->flags & BIO_FLAGS_MEM_RDONLY) {
        ERR_raise(ERR_LIB_BIO, BIO_R_WRITE_TO_READ_ONLY_BIO);
        goto end;
    }
    BIO_clear_retry_flags(b);
    if (inl == 0)
        return 0;
    if (in == NULL) {
        ERR_raise(ERR_LIB_BIO, ERR_R_PASSED_NULL_PARAMETER);
        goto end;
    }
    blen = bbm->readp->length;
    mem_buf_sync(b);
    if (BUF_MEM_grow_clean(bbm->buf, blen + inl) == 0)
        goto end;
    memcpy(bbm->buf->data + blen, in, inl);
    *bbm->readp = *bbm->buf;
    ret = inl;
 end:
    return ret;
}